

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.cpp
# Opt level: O1

void __thiscall
sf::Transform::Transform
          (Transform *this,float a00,float a01,float a02,float a10,float a11,float a12,float a20,
          float a21,float a22)

{
  this->m_matrix[0] = a00;
  this->m_matrix[4] = a01;
  this->m_matrix[0xc] = a02;
  this->m_matrix[1] = a10;
  this->m_matrix[5] = a11;
  this->m_matrix[0xd] = a12;
  this->m_matrix[2] = 0.0;
  this->m_matrix[6] = 0.0;
  this->m_matrix[0xe] = 0.0;
  this->m_matrix[3] = a20;
  this->m_matrix[7] = a21;
  this->m_matrix[8] = 0.0;
  this->m_matrix[9] = 0.0;
  this->m_matrix[10] = 1.0;
  this->m_matrix[0xb] = 0.0;
  this->m_matrix[0xf] = a22;
  return;
}

Assistant:

Transform::Transform(float a00, float a01, float a02,
                     float a10, float a11, float a12,
                     float a20, float a21, float a22)
{
    m_matrix[0] = a00; m_matrix[4] = a01; m_matrix[8]  = 0.f; m_matrix[12] = a02;
    m_matrix[1] = a10; m_matrix[5] = a11; m_matrix[9]  = 0.f; m_matrix[13] = a12;
    m_matrix[2] = 0.f; m_matrix[6] = 0.f; m_matrix[10] = 1.f; m_matrix[14] = 0.f;
    m_matrix[3] = a20; m_matrix[7] = a21; m_matrix[11] = 0.f; m_matrix[15] = a22;
}